

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

Message * __thiscall testing::Message::operator<<(Message *this,ProbeStats *val)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  double dVar10;
  undefined1 auVar11 [16];
  vector<double,_std::allocator<double>_> local_40;
  
  poVar9 = (ostream *)
           ((this->ss_)._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{AvgRatio:",10);
  pdVar1 = (val->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar10 = 0.0;
  pdVar7 = (val->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar8 = pdVar7; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    dVar10 = dVar10 + *pdVar8;
  }
  lVar4 = (long)pdVar1 - (long)pdVar7;
  lVar5 = lVar4 >> 3;
  auVar11._8_4_ = (int)(lVar4 >> 0x23);
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", MaxRatio:",0xb);
  pdVar7 = (val->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (val->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar8 = pdVar7 + 1;
  if (pdVar8 != pdVar1 && pdVar7 != pdVar1) {
    dVar10 = *pdVar7;
    do {
      dVar2 = *pdVar8;
      pdVar3 = pdVar8;
      if (*pdVar8 <= dVar10) {
        dVar2 = dVar10;
        pdVar3 = pdVar7;
      }
      pdVar7 = pdVar3;
      dVar10 = dVar2;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar1);
  }
  poVar6 = std::ostream::_M_insert<double>(*pdVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", PercentileRatio:",0x12);
  dVar10 = phmap::priv::anon_unknown_0::ProbeStats::PercentileRatio(val,0.95);
  poVar6 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", MaxProbe:",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", Probes=[",10);
  phmap::priv::anon_unknown_0::ProbeStats::ProbeNormalizedHistogram
            (&local_40,
             (ProbeStats *)
             (val->all_probes_histogram).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  for (pdVar7 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 != local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
    poVar6 = std::ostream::_M_insert<double>(*pdVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]}",2);
  return this;
}

Assistant:

inline Message& operator<<(const T& val) {
        // Some libraries overload << for STL containers.  These
    // overloads are defined in the global namespace instead of ::std.
    //
    // C++'s symbol lookup rule (i.e. Koenig lookup) says that these
    // overloads are visible in either the std namespace or the global
    // namespace, but not other namespaces, including the testing
    // namespace which Google Test's Message class is in.
    //
    // To allow STL containers (and other types that has a << operator
    // defined in the global namespace) to be used in Google Test
    // assertions, testing::Message must access the custom << operator
    // from the global namespace.  With this using declaration,
    // overloads of << defined in the global namespace and those
    // visible via Koenig lookup are both exposed in this function.
    using ::operator<<;
    *ss_ << val;
    return *this;
  }